

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O1

QByteArray * cleaned(QByteArray *__return_storage_ptr__,QByteArray *input)

{
  char *pcVar1;
  long lVar2;
  Data *pDVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  char *__s;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  bool bVar11;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize((longlong)__return_storage_ptr__);
  pcVar9 = (input->d).ptr;
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)&QByteArray::_empty;
  }
  lVar2 = (input->d).size;
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  __s = (__return_storage_ptr__->d).ptr;
  if (lVar2 != 0) {
    pcVar8 = pcVar9 + lVar2;
    uVar5 = 0;
LAB_00134e6c:
    do {
      if ((*pcVar9 == ' ') || (*pcVar9 == '\t')) {
        pcVar9 = pcVar9 + 1;
        if (pcVar9 != pcVar8) goto LAB_00134e6c;
      }
      bVar11 = *pcVar9 == '#';
      if (*pcVar9 == '%') {
        bVar11 = pcVar9[1] == ':';
        if (bVar11) {
          pcVar9 = pcVar9 + 1;
        }
      }
      pcVar6 = __s;
      if (bVar11) {
        *__s = '#';
        pcVar6 = __s + 1;
        do {
          pcVar9 = pcVar9 + 1;
          if (pcVar9 == pcVar8) break;
        } while ((*pcVar9 == ' ') || (*pcVar9 == '\t'));
      }
      do {
        __s = pcVar6;
        if (pcVar9 == pcVar8) break;
        uVar7 = -uVar5;
        while (*pcVar9 == '\\') {
          if (pcVar9[1] == '\r') {
            pcVar9 = pcVar9 + 1;
          }
          if ((pcVar9 == pcVar8) || ((pcVar9[1] != '\n' && (*pcVar9 != '\r')))) goto LAB_00134f39;
          pcVar1 = pcVar9 + 1;
          pcVar10 = pcVar1;
          if (pcVar9[1] != '\r') {
            pcVar10 = pcVar9 + 2;
          }
          pcVar9 = pcVar10;
          if (pcVar1 == pcVar8) {
            pcVar9 = pcVar1;
          }
          uVar7 = uVar7 - 1;
          if (pcVar9 == pcVar8) goto LAB_00134f99;
        }
        if ((*pcVar9 == '\r') && (pcVar9[1] == '\n')) {
          pcVar9 = pcVar9 + 1;
        }
LAB_00134f39:
        if (pcVar9 == pcVar8) {
LAB_00134f99:
          uVar5 = -uVar7;
          break;
        }
        cVar4 = *pcVar9;
        if (*pcVar9 == '\r') {
          cVar4 = '\n';
        }
        *pcVar6 = cVar4;
        __s = pcVar6 + 1;
        cVar4 = *pcVar9;
        uVar5 = -uVar7;
        if ((cVar4 == '\n') && (uVar5 = 0, uVar7 != 0)) {
          memset(__s,10,(ulong)-uVar7);
          __s = pcVar6 + (ulong)~uVar7 + 2;
        }
        pcVar9 = pcVar9 + 1;
        pcVar6 = __s;
      } while (cVar4 != '\n');
    } while (pcVar9 != pcVar8);
  }
  QByteArray::resize((longlong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static QByteArray cleaned(const QByteArray &input)
{
    QByteArray result;
    result.resize(input.size());
    const char *data = input.constData();
    const char *end = input.constData() + input.size();
    char *output = result.data();

    int newlines = 0;
    while (data != end) {
        while (data != end && is_space(*data))
            ++data;
        bool takeLine = (*data == '#');
        if (*data == '%' && *(data+1) == ':') {
            takeLine = true;
            ++data;
        }
        if (takeLine) {
            *output = '#';
            ++output;
            do ++data; while (data != end && is_space(*data));
        }
        while (data != end) {
            // handle \\\n, \\\r\n and \\\r
            if (*data == '\\') {
                if (*(data + 1) == '\r') {
                    ++data;
                }
                if (data != end && (*(data + 1) == '\n' || (*data) == '\r')) {
                    ++newlines;
                    data += 1;
                    if (data != end && *data != '\r')
                        data += 1;
                    continue;
                }
            } else if (*data == '\r' && *(data + 1) == '\n') { // reduce \r\n to \n
                ++data;
            }
            if (data == end)
                break;

            char ch = *data;
            if (ch == '\r') // os9: replace \r with \n
                ch = '\n';
            *output = ch;
            ++output;

            if (*data == '\n') {
                // output additional newlines to keep the correct line-numbering
                // for the lines following the backslash-newline sequence(s)
                while (newlines) {
                    *output = '\n';
                    ++output;
                    --newlines;
                }
                ++data;
                break;
            }
            ++data;
        }
    }
    result.resize(output - result.constData());
    return result;
}